

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O2

Result __thiscall
wabt::WastParser::ParsePlainLoadStoreInstr<wabt::LoadStoreExpr<(wabt::ExprType)44>>
          (WastParser *this,Location loc,Token token,
          unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *out_expr)

{
  Expr *pEVar1;
  Opcode OVar2;
  Expr *pEVar3;
  uint32_t align;
  uint32_t offset;
  
  OVar2 = Token::opcode(&token);
  ParseOffsetOpt(this,&offset);
  ParseAlignOpt(this,&align);
  pEVar3 = (Expr *)operator_new(0x48);
  (pEVar3->super_intrusive_list_base<wabt::Expr>).next_ = (Expr *)0x0;
  (pEVar3->super_intrusive_list_base<wabt::Expr>).prev_ = (Expr *)0x0;
  *(undefined4 *)&(pEVar3->loc).filename.data_ = loc.filename.data_._0_4_;
  *(undefined4 *)((long)&(pEVar3->loc).filename.data_ + 4) = loc.filename.data_._4_4_;
  *(undefined4 *)&(pEVar3->loc).filename.size_ = (undefined4)loc.filename.size_;
  *(undefined4 *)((long)&(pEVar3->loc).filename.size_ + 4) = loc.filename.size_._4_4_;
  (pEVar3->loc).field_1.field_0.line = loc.field_1.field_0.line;
  (pEVar3->loc).field_1.field_0.first_column = loc.field_1.field_0.first_column;
  (pEVar3->loc).field_1.field_0.last_column = loc.field_1.field_0.last_column;
  *(undefined4 *)((long)&(pEVar3->loc).field_1 + 0xc) = loc.field_1._12_4_;
  pEVar3->type_ = Store;
  pEVar3->_vptr_Expr = (_func_int **)&PTR__Expr_001dab70;
  *(Enum *)&pEVar3->field_0x3c = OVar2.enum_;
  *(uint32_t *)&pEVar3[1]._vptr_Expr = align;
  *(uint32_t *)((long)&pEVar3[1]._vptr_Expr + 4) = offset;
  pEVar1 = (out_expr->_M_t).super___uniq_ptr_impl<wabt::Expr,_std::default_delete<wabt::Expr>_>._M_t
           .super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
           super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl;
  (out_expr->_M_t).super___uniq_ptr_impl<wabt::Expr,_std::default_delete<wabt::Expr>_>._M_t.
  super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
  super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl = pEVar3;
  if (pEVar1 != (Expr *)0x0) {
    (*pEVar1->_vptr_Expr[1])();
  }
  return (Result)Ok;
}

Assistant:

Result WastParser::ParsePlainLoadStoreInstr(Location loc,
                                            Token token,
                                            std::unique_ptr<Expr>* out_expr) {
  Opcode opcode = token.opcode();
  uint32_t offset;
  uint32_t align;
  ParseOffsetOpt(&offset);
  ParseAlignOpt(&align);
  out_expr->reset(new T(opcode, align, offset, loc));
  return Result::Ok;
}